

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_buffered_stream.h
# Opt level: O2

string * __thiscall
google::protobuf::json_internal::MaybeOwnedString::ToString_abi_cxx11_(MaybeOwnedString *this)

{
  variant_alternative_t<0UL,_variant<basic_string<char>,_StreamOwned>_> *pvVar1;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string_view local_20;
  
  if (*(__index_type *)
       ((long)&(this->data_).
               super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
               .
               super__Move_assign_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
               .
               super__Copy_assign_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
               .
               super__Move_ctor_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
               .
               super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
               .
               super__Variant_storage_alias<std::__cxx11::basic_string<char>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
       + 0x20) == '\x01') {
    local_20 = StreamOwned::AsView((StreamOwned *)this);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_40,&local_20,&local_41);
    std::
    variant<std::__cxx11::string,google::protobuf::json_internal::MaybeOwnedString::StreamOwned>::
    operator=((variant<std::__cxx11::string,google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
               *)this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    local_40._M_dataplus._M_p = (pointer)0x0;
    BufferingGuard::operator=(&this->token_,(BufferingGuard *)&local_40);
    BufferingGuard::~BufferingGuard((BufferingGuard *)&local_40);
  }
  pvVar1 = std::
           get<0ul,std::__cxx11::string,google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                     (&this->data_);
  return pvVar1;
}

Assistant:

std::string& ToString() {
    if (auto* unowned = absl::get_if<StreamOwned>(&data_)) {
      data_ = std::string(unowned->AsView());
      token_ = BufferingGuard{};
    }

    return absl::get<std::string>(data_);
  }